

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall chaiscript::parser::ChaiScript_Parser::For_Guards(ChaiScript_Parser *this)

{
  bool bVar1;
  Noop_AST_Node *pNVar2;
  eval_error *peVar3;
  undefined1 local_48 [32];
  File_Position local_28;
  
  bVar1 = Equation(this);
  if (bVar1) {
    SkipWS(this,false);
    bVar1 = Eol_(this,false);
    if (!bVar1) goto LAB_001a7bcd;
  }
  else {
LAB_001a7bcd:
    SkipWS(this,false);
    bVar1 = Eol_(this,false);
    if (!bVar1) {
      peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"\'for\' loop initial statment missing","");
      local_28.line = (this->m_position).line;
      local_28.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar3,(string *)local_48,&local_28,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    pNVar2 = (Noop_AST_Node *)operator_new(0x98);
    eval::Noop_AST_Node::Noop_AST_Node(pNVar2);
    std::__shared_ptr<chaiscript::AST_Node,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chaiscript::AST_Node,void>
              ((__shared_ptr<chaiscript::AST_Node,(__gnu_cxx::_Lock_policy)2> *)local_48,
               (AST_Node *)pNVar2);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
    ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
              ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
                *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)local_48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  bVar1 = Equation(this);
  if (bVar1) {
    SkipWS(this,false);
    bVar1 = Eol_(this,false);
    if (bVar1) goto LAB_001a7cab;
  }
  SkipWS(this,false);
  bVar1 = Eol_(this,false);
  if (!bVar1) {
    peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"\'for\' loop condition missing","");
    local_28.line = (this->m_position).line;
    local_28.column = (this->m_position).col;
    exception::eval_error::eval_error
              (peVar3,(string *)local_48,&local_28,
               (this->m_filename).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  pNVar2 = (Noop_AST_Node *)operator_new(0x98);
  eval::Noop_AST_Node::Noop_AST_Node(pNVar2);
  std::__shared_ptr<chaiscript::AST_Node,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::AST_Node,void>
            ((__shared_ptr<chaiscript::AST_Node,(__gnu_cxx::_Lock_policy)2> *)local_48,
             (AST_Node *)pNVar2);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
  ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
            ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
              *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
LAB_001a7cab:
  bVar1 = Equation(this);
  if (!bVar1) {
    pNVar2 = (Noop_AST_Node *)operator_new(0x98);
    eval::Noop_AST_Node::Noop_AST_Node(pNVar2);
    std::__shared_ptr<chaiscript::AST_Node,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chaiscript::AST_Node,void>
              ((__shared_ptr<chaiscript::AST_Node,(__gnu_cxx::_Lock_policy)2> *)local_48,
               (AST_Node *)pNVar2);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
    ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
              ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
                *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)local_48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  return true;
}

Assistant:

bool For_Guards() {
        if (!(Equation() && Eol()))
        {
          if (!Eol())
          {
            throw exception::eval_error("'for' loop initial statment missing", File_Position(m_position.line, m_position.col), *m_filename);
          } else {
            m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
          }
        }

        if (!(Equation() && Eol()))
        {
          if (!Eol())
          {
            throw exception::eval_error("'for' loop condition missing", File_Position(m_position.line, m_position.col), *m_filename);
          } else {
            m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
          }
        }

        if (!Equation())
        {
          m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
        }

        return true; 
      }